

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::ServiceDescriptorProto::InternalSwap
          (ServiceDescriptorProto *this,ServiceDescriptorProto *other)

{
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *this_00;
  ServiceDescriptorProto *this_01;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  *__b;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  *in_RSI;
  long in_RDI;
  UnknownFieldSet *in_stack_ffffffffffffff28;
  RepeatedPtrField<google::protobuf::MethodDescriptorProto> *in_stack_ffffffffffffff30;
  
  this_00 = (InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
             *)(in_RSI + 1);
  if (((uint)*(undefined8 *)(in_RDI + 8) & 1) != 1) {
    if (((uint)*(undefined8 *)this_00 & 1) != 1) goto LAB_0051b2e6;
  }
  if (((uint)*(undefined8 *)this_00 & 1) == 1) {
    internal::
    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
    ::
    PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
              (this_00);
  }
  else {
    internal::
    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
    ::mutable_unknown_fields_slow(in_RSI);
  }
  internal::InternalMetadataWithArena::DoSwap
            ((InternalMetadataWithArena *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
LAB_0051b2e6:
  std::swap<unsigned_int>((uint *)(in_RDI + 0x10),(uint *)(in_RSI + 2));
  RepeatedPtrField<google::protobuf::MethodDescriptorProto>::InternalSwap
            (in_stack_ffffffffffffff30,
             (RepeatedPtrField<google::protobuf::MethodDescriptorProto> *)in_stack_ffffffffffffff28)
  ;
  this_01 = (ServiceDescriptorProto *)(in_RDI + 0x30);
  __b = in_RSI + 6;
  internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  GetArenaNoVirtual(this_01);
  std::swap<std::__cxx11::string*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this_01,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)__b);
  std::swap<google::protobuf::ServiceOptions*>
            ((ServiceOptions **)(in_RDI + 0x38),(ServiceOptions **)(in_RSI + 7));
  return;
}

Assistant:

void ServiceDescriptorProto::InternalSwap(ServiceDescriptorProto* other) {
  using std::swap;
  _internal_metadata_.Swap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  method_.InternalSwap(&other->method_);
  name_.Swap(&other->name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  swap(options_, other->options_);
}